

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O3

int Scl_CommandReadConstr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  uint fVerbose;
  
  Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while ((iVar1 = Extra_UtilGetopt(argc,argv,"nvh"), iVar1 == 0x6e || (iVar1 == 0x76))) {
    fVerbose = fVerbose ^ 1;
  }
  if ((iVar1 == -1) && (globalUtilOptind + 1 == argc)) {
    pcVar2 = argv[globalUtilOptind];
    __stream = fopen(pcVar2,"rb");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      Abc_SclReadTimingConstr(pAbc,pcVar2,fVerbose);
      return 0;
    }
    fprintf((FILE *)pAbc->Err,"Cannot open input file \"%s\". \n",pcVar2);
  }
  else {
    fwrite("usage: read_constr [-nvh] <file>\n",0x21,1,(FILE *)pAbc->Err);
    fwrite("\t         read file with timing constraints for standard-cell designs\n",0x46,1,
           (FILE *)pAbc->Err);
    fprintf((FILE *)pAbc->Err,"\t-n     : toggle using new constraint file format [default = %s]\n",
            "no");
    pcVar2 = "yes";
    if (fVerbose == 0) {
      pcVar2 = "no";
    }
    fprintf((FILE *)pAbc->Err,"\t-v     : toggle printing verbose information [default = %s]\n",
            pcVar2);
    fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
    fwrite("\t<file> : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
  }
  return 1;
}

Assistant:

int Scl_CommandReadConstr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Abc_Nam_t * Abc_NtkNameMan( Abc_Ntk_t * p, int fOuts );
    extern void Abc_SclReadTimingConstr( Abc_Frame_t * pAbc, char * pFileName, int fVerbose );
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    FILE * pFile;
    char * pFileName;
    int fUseNewFormat = 0;
    int c, fVerbose = 0;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "nvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'n':
            fVerbose ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;

    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "rb" )) == NULL )
    {
        fprintf( pAbc->Err, "Cannot open input file \"%s\". \n", pFileName );
        return 1;
    }
    fclose( pFile );

    if ( !fUseNewFormat )
        Abc_SclReadTimingConstr( pAbc, pFileName, fVerbose );
    else
    {
        if ( pNtk == NULL )
        {
            fprintf( pAbc->Err, "There is no current network.\n" );
            return 1;
        }
        // input constraint manager
        if ( pNtk )
        {
            Scl_Con_t * pCon = Scl_ConRead( pFileName, Abc_NtkNameMan(pNtk, 0), Abc_NtkNameMan(pNtk, 1) );
            if ( pCon ) Scl_ConUpdateMan( pAbc, pCon );
        }
    }
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_constr [-nvh] <file>\n" );
    fprintf( pAbc->Err, "\t         read file with timing constraints for standard-cell designs\n" );
    fprintf( pAbc->Err, "\t-n     : toggle using new constraint file format [default = %s]\n", fUseNewFormat? "yes": "no" );
    fprintf( pAbc->Err, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\t<file> : the name of a file to read\n" );
    return 1;
}